

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

void Json::CharReaderBuilder::strictMode(Value *settings)

{
  Value *pVVar1;
  Value local_30;
  
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"allowComments");
  Value::operator=(pVVar1,&local_30);
  Value::~Value(&local_30);
  Value::Value(&local_30,true);
  pVVar1 = Value::operator[](settings,"strictRoot");
  Value::operator=(pVVar1,&local_30);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"allowDroppedNullPlaceholders");
  Value::operator=(pVVar1,&local_30);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"allowNumericKeys");
  Value::operator=(pVVar1,&local_30);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"allowSingleQuotes");
  Value::operator=(pVVar1,&local_30);
  Value::~Value(&local_30);
  Value::Value(&local_30,1000);
  pVVar1 = Value::operator[](settings,"stackLimit");
  Value::operator=(pVVar1,&local_30);
  Value::~Value(&local_30);
  Value::Value(&local_30,true);
  pVVar1 = Value::operator[](settings,"failIfExtra");
  Value::operator=(pVVar1,&local_30);
  Value::~Value(&local_30);
  Value::Value(&local_30,true);
  pVVar1 = Value::operator[](settings,"rejectDupKeys");
  Value::operator=(pVVar1,&local_30);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"allowSpecialFloats");
  Value::operator=(pVVar1,&local_30);
  Value::~Value(&local_30);
  return;
}

Assistant:

void CharReaderBuilder::strictMode(Json::Value* settings) {
  //! [CharReaderBuilderStrictMode]
  (*settings)["allowComments"] = false;
  (*settings)["strictRoot"] = true;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = true;
  (*settings)["rejectDupKeys"] = true;
  (*settings)["allowSpecialFloats"] = false;
  //! [CharReaderBuilderStrictMode]
}